

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O3

void cleanup_PRG_and_CHR_banks(void)

{
  uint8_t **ppuVar1;
  ulong uVar2;
  ulong uVar3;
  
  ppuVar1 = PRG_rom_banks;
  uVar2 = (ulong)parsed_header.PRG_ROM_chunks;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      free(ppuVar1[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  ppuVar1 = CHR_rom_banks;
  uVar2 = (ulong)parsed_header.CHR_ROM_chunks;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      free(ppuVar1[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  free(PRG_rom_banks);
  free(ppuVar1);
  return;
}

Assistant:

void cleanup_PRG_and_CHR_banks() {
    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        free(PRG_rom_banks[bank_num]);
    }

    for(uint8_t bank_num = 0; bank_num < parsed_header.CHR_ROM_chunks; bank_num++) {
        free(CHR_rom_banks[bank_num]);
    }

    free(PRG_rom_banks);
    free(CHR_rom_banks);
}